

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::~BaseRenderingTestInstance
          (BaseRenderingTestInstance *this)

{
  BaseRenderingTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_016b23e8;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_resultBufferMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&this->m_resultBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&this->m_fence);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_fragmentShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_vertexShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&this->m_pipelineLayout);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_uniformBufferMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&this->m_uniformBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&this->m_descriptorSet);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&this->m_frameBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&this->m_resolvedImageView);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_resolvedImageMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&this->m_resolvedImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&this->m_imageView);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_imageMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&this->m_image);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&this->m_commandPool);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

BaseRenderingTestInstance::~BaseRenderingTestInstance (void)
{
}